

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib554.c
# Opt level: O1

int once(char *URL,_Bool oldstyle)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  undefined7 in_register_00000031;
  undefined8 uVar4;
  char *pcVar5;
  curl_httppost *formpost;
  curl_httppost *lastptr;
  WriteThis pooh;
  WriteThis pooh2;
  
  formpost = (curl_httppost *)0x0;
  lastptr = (curl_httppost *)0x0;
  pooh.readptr = data;
  pooh.sizeleft = strlen(data);
  if ((int)CONCAT71(in_register_00000031,oldstyle) == 0) {
    pcVar3 = "sendfile alternative";
    pcVar5 = "file name 2";
    uVar4 = 0x14;
  }
  else {
    pcVar3 = "sendfile";
    pcVar5 = "postit2.c";
    uVar4 = 6;
  }
  iVar1 = curl_formadd(&formpost,&lastptr,1,pcVar3,0x13,&pooh,uVar4,pooh.sizeleft,0x10,pcVar5,0x11);
  if (iVar1 != 0) {
    curl_mprintf("curl_formadd(1) = %d\n",iVar1);
  }
  pooh2.readptr = data;
  pooh2.sizeleft = strlen(data);
  iVar1 = curl_formadd(&formpost,&lastptr,1,"callbackdata",0x13,&pooh2,6,pooh2.sizeleft,0x11);
  if (iVar1 != 0) {
    curl_mprintf("curl_formadd(2) = %d\n",iVar1);
  }
  iVar1 = curl_formadd(&formpost,&lastptr,1,"filename",4,"postit2.c",0x11);
  if (iVar1 != 0) {
    curl_mprintf("curl_formadd(3) = %d\n",iVar1);
  }
  iVar1 = curl_formadd(&formpost,&lastptr,1,"submit",4,"send",0xe,"text/plain",0x11);
  if (iVar1 != 0) {
    curl_mprintf("curl_formadd(4) = %d\n",iVar1);
  }
  iVar1 = curl_formadd(&formpost,&lastptr,1,"somename",0xb,"somefile.txt",0xc,"blah blah",0xd,9,0x11
                      );
  if (iVar1 != 0) {
    curl_mprintf("curl_formadd(5) = %d\n",iVar1);
  }
  lVar2 = curl_easy_init();
  if (lVar2 == 0) {
    curl_mfprintf(_stderr,"curl_easy_init() failed\n");
    curl_formfree(formpost);
    curl_global_cleanup();
    iVar1 = 0x7e;
  }
  else {
    iVar1 = curl_easy_setopt(lVar2,0x2712,URL);
    if (iVar1 == 0) {
      iVar1 = curl_easy_setopt(lVar2,0x2f,1);
      if (iVar1 == 0) {
        iVar1 = curl_easy_setopt(lVar2,0x3c,pooh.sizeleft);
        if (iVar1 == 0) {
          iVar1 = curl_easy_setopt(lVar2,0x4e2c,read_callback);
          if (iVar1 == 0) {
            iVar1 = curl_easy_setopt(lVar2,0x2728,formpost);
            if (iVar1 == 0) {
              iVar1 = curl_easy_setopt(lVar2,0x29,1);
              if (iVar1 == 0) {
                iVar1 = curl_easy_setopt(lVar2,0x2a,1);
                if (iVar1 == 0) {
                  iVar1 = curl_easy_perform(lVar2);
                }
              }
            }
          }
        }
      }
    }
    curl_easy_cleanup(lVar2);
    curl_formfree(formpost);
  }
  return iVar1;
}

Assistant:

static int once(char *URL, bool oldstyle)
{
  CURL *curl;
  CURLcode res = CURLE_OK;
  CURLFORMcode formrc;

  struct curl_httppost *formpost = NULL;
  struct curl_httppost *lastptr = NULL;
  struct WriteThis pooh;
  struct WriteThis pooh2;

  pooh.readptr = data;
  pooh.sizeleft = strlen(data);

  /* Fill in the file upload field */
  if(oldstyle) {
    formrc = curl_formadd(&formpost,
                          &lastptr,
                          CURLFORM_COPYNAME, "sendfile",
                          CURLFORM_STREAM, &pooh,
                          CURLFORM_CONTENTSLENGTH, (long)pooh.sizeleft,
                          CURLFORM_FILENAME, "postit2.c",
                          CURLFORM_END);
  }
  else {
    /* new style */
    formrc = curl_formadd(&formpost,
                          &lastptr,
                          CURLFORM_COPYNAME, "sendfile alternative",
                          CURLFORM_STREAM, &pooh,
                          CURLFORM_CONTENTLEN, (curl_off_t)pooh.sizeleft,
                          CURLFORM_FILENAME, "file name 2",
                          CURLFORM_END);
  }

  if(formrc)
    printf("curl_formadd(1) = %d\n", (int)formrc);

  /* Now add the same data with another name and make it not look like
     a file upload but still using the callback */

  pooh2.readptr = data;
  pooh2.sizeleft = strlen(data);

  /* Fill in the file upload field */
  formrc = curl_formadd(&formpost,
                        &lastptr,
                        CURLFORM_COPYNAME, "callbackdata",
                        CURLFORM_STREAM, &pooh2,
                        CURLFORM_CONTENTSLENGTH, (long)pooh2.sizeleft,
                        CURLFORM_END);

  if(formrc)
    printf("curl_formadd(2) = %d\n", (int)formrc);

  /* Fill in the filename field */
  formrc = curl_formadd(&formpost,
                        &lastptr,
                        CURLFORM_COPYNAME, "filename",
#ifdef CURL_DOES_CONVERSIONS
                        /* ASCII representation with escape
                           sequences for non-ASCII platforms */
                        CURLFORM_COPYCONTENTS,
                           "\x70\x6f\x73\x74\x69\x74\x32\x2e\x63",
#else
                        CURLFORM_COPYCONTENTS, "postit2.c",
#endif
                        CURLFORM_END);

  if(formrc)
    printf("curl_formadd(3) = %d\n", (int)formrc);

  /* Fill in a submit field too */
  formrc = curl_formadd(&formpost,
                        &lastptr,
                        CURLFORM_COPYNAME, "submit",
#ifdef CURL_DOES_CONVERSIONS
                        /* ASCII representation with escape
                           sequences for non-ASCII platforms */
                        CURLFORM_COPYCONTENTS, "\x73\x65\x6e\x64",
#else
                        CURLFORM_COPYCONTENTS, "send",
#endif
                        CURLFORM_CONTENTTYPE, "text/plain",
                        CURLFORM_END);

  if(formrc)
    printf("curl_formadd(4) = %d\n", (int)formrc);

  formrc = curl_formadd(&formpost, &lastptr,
                        CURLFORM_COPYNAME, "somename",
                        CURLFORM_BUFFER, "somefile.txt",
                        CURLFORM_BUFFERPTR, "blah blah",
                        CURLFORM_BUFFERLENGTH, (long)9,
                        CURLFORM_END);

  if(formrc)
    printf("curl_formadd(5) = %d\n", (int)formrc);

  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_formfree(formpost);
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  /* First set the URL that is about to receive our POST. */
  test_setopt(curl, CURLOPT_URL, URL);

  /* Now specify we want to POST data */
  test_setopt(curl, CURLOPT_POST, 1L);

  /* Set the expected POST size */
  test_setopt(curl, CURLOPT_POSTFIELDSIZE, (long)pooh.sizeleft);

  /* we want to use our own read function */
  test_setopt(curl, CURLOPT_READFUNCTION, read_callback);

  /* send a multi-part formpost */
  test_setopt(curl, CURLOPT_HTTPPOST, formpost);

  /* get verbose debug output please */
  test_setopt(curl, CURLOPT_VERBOSE, 1L);

  /* include headers in the output */
  test_setopt(curl, CURLOPT_HEADER, 1L);

  /* Perform the request, res will get the return code */
  res = curl_easy_perform(curl);

test_cleanup:

  /* always cleanup */
  curl_easy_cleanup(curl);

  /* now cleanup the formpost chain */
  curl_formfree(formpost);

  return res;
}